

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameResolveTrigger(Parse *pParse)

{
  Trigger *pTVar1;
  Schema *pSVar2;
  anon_union_8_4_82a96254_for_uNC aVar3;
  int iVar4;
  uint uVar5;
  Table *pTable;
  SrcList *pSrc;
  Select *pSVar6;
  SrcList *pSVar7;
  long lVar8;
  Schema **ppSVar9;
  Upsert *pUpsert;
  long lVar10;
  sqlite3 *db;
  TriggerStep *pStep;
  NameContext local_70;
  sqlite3 *local_38;
  
  db = pParse->db;
  pTVar1 = pParse->pNewTrigger;
  local_70._40_8_ = 0;
  local_70.pWinSelect = (Select *)0x0;
  local_70.pNext = (NameContext *)0x0;
  local_70.nRef = 0;
  local_70.nNcErr = 0;
  local_70.pSrcList = (SrcList *)0x0;
  local_70.uNC.pEList = (ExprList *)0x0;
  if (pTVar1->pTabSchema == (Schema *)0x0) {
    lVar8 = -0x8000;
  }
  else {
    lVar8 = -0x100000000;
    ppSVar9 = &db->aDb->pSchema;
    do {
      lVar8 = lVar8 + 0x100000000;
      pSVar2 = *ppSVar9;
      ppSVar9 = ppSVar9 + 4;
    } while (pSVar2 != pTVar1->pTabSchema);
    lVar8 = lVar8 >> 0x20;
  }
  local_70.pParse = pParse;
  pTable = sqlite3FindTable(db,pTVar1->table,db->aDb[lVar8].zDbSName);
  pParse->pTriggerTab = pTable;
  pParse->eTriggerOp = pTVar1->op;
  if ((pTable == (Table *)0x0) ||
     (((pTable->eTabType != '\x01' && (0 < pTable->nCol)) ||
      (iVar4 = viewGetColumnNames(pParse,pTable), iVar4 == 0)))) {
    if (pTVar1->pWhen == (Expr *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = sqlite3ResolveExprNames(&local_70,pTVar1->pWhen);
    }
    pStep = pTVar1->step_list;
    local_38 = db;
    if (pStep != (TriggerStep *)0x0 && iVar4 == 0) {
      do {
        if (((pStep->pSelect != (Select *)0x0) &&
            (sqlite3SelectPrep(pParse,pStep->pSelect,&local_70), pParse->nErr != 0)) &&
           (pParse->rc != 0)) {
          return pParse->rc;
        }
        if (pStep->zTarget == (char *)0x0) {
          uVar5 = 0;
        }
        else {
          pSrc = sqlite3TriggerStepSrc(pParse,pStep);
          if (pSrc == (SrcList *)0x0) {
            return 7;
          }
          pSVar6 = sqlite3SelectNew(pParse,pStep->pExprList,pSrc,(Expr *)0x0,(ExprList *)0x0,
                                    (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
          if (pSVar6 == (Select *)0x0) {
            pStep->pExprList = (ExprList *)0x0;
            uVar5 = 7;
            pSrc = (SrcList *)0x0;
          }
          else {
            sqlite3SelectPrep(pParse,pSVar6,(NameContext *)0x0);
            iVar4 = pParse->nErr;
            if (pStep->pExprList != (ExprList *)0x0) {
              pSVar6->pEList = (ExprList *)0x0;
            }
            uVar5 = (uint)(iVar4 != 0);
            pSVar6->pSrc = (SrcList *)0x0;
            clearSelect(db,pSVar6,1);
          }
          pSVar7 = pStep->pFrom;
          if (((pSVar7 != (SrcList *)0x0) && (iVar4 = pSVar7->nSrc, 0 < iVar4)) && (uVar5 == 0)) {
            lVar8 = 0x30;
            lVar10 = 0;
            do {
              pSVar6 = *(Select **)((long)pSVar7->a + lVar8 + -8);
              if (pSVar6 != (Select *)0x0) {
                sqlite3SelectPrep(pParse,pSVar6,(NameContext *)0x0);
                pSVar7 = pStep->pFrom;
                iVar4 = pSVar7->nSrc;
              }
              lVar10 = lVar10 + 1;
              lVar8 = lVar8 + 0x68;
            } while (lVar10 < iVar4);
          }
          db = local_38;
          if (local_38->mallocFailed != '\0') {
            uVar5 = 7;
          }
          if (uVar5 == 0) {
            local_70.pSrcList = pSrc;
            if (pStep->pWhere != (Expr *)0x0) {
              iVar4 = sqlite3ResolveExprNames(&local_70,pStep->pWhere);
              uVar5 = 1;
              if (iVar4 != 0) goto LAB_001ba102;
            }
            uVar5 = sqlite3ResolveExprListNames(&local_70,pStep->pExprList);
            aVar3 = (anon_union_8_4_82a96254_for_uNC)pStep->pUpsert;
            if (uVar5 == 0 && (Upsert *)aVar3.pEList != (Upsert *)0x0) {
              (aVar3.pUpsert)->pUpsertSrc = pSrc;
              local_70.ncFlags = 0x200;
              local_70.uNC = aVar3;
              uVar5 = sqlite3ResolveExprListNames(&local_70,(aVar3.pUpsert)->pUpsertTarget);
              if ((uVar5 == 0) &&
                 (uVar5 = sqlite3ResolveExprListNames(&local_70,(aVar3.pUpsert)->pUpsertSet),
                 uVar5 == 0)) {
                iVar4 = sqlite3ResolveExprNames(&local_70,*(Expr **)&(aVar3.pEList)->a[0].fg);
                uVar5 = 1;
                if (iVar4 == 0) {
                  uVar5 = sqlite3ResolveExprNames(&local_70,(aVar3.pEList)->a[0].pExpr);
                }
              }
              local_70._40_8_ = local_70._40_8_ & 0xffffffff00000000;
            }
          }
LAB_001ba102:
          local_70.pSrcList = (SrcList *)0x0;
          sqlite3SrcListDelete(db,pSrc);
        }
        if (uVar5 != 0) {
          return uVar5;
        }
        pStep = pStep->pNext;
        if (pStep == (TriggerStep *)0x0) {
          return 0;
        }
      } while( true );
    }
  }
  return iVar4;
}

Assistant:

static int renameResolveTrigger(Parse *pParse){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table,
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      SrcList *pSrc = sqlite3TriggerStepSrc(pParse, pStep);
      if( pSrc ){
        Select *pSel = sqlite3SelectNew(
            pParse, pStep->pExprList, pSrc, 0, 0, 0, 0, 0, 0
        );
        if( pSel==0 ){
          pStep->pExprList = 0;
          pSrc = 0;
          rc = SQLITE_NOMEM;
        }else{
          sqlite3SelectPrep(pParse, pSel, 0);
          rc = pParse->nErr ? SQLITE_ERROR : SQLITE_OK;
          assert( pStep->pExprList==0 || pStep->pExprList==pSel->pEList );
          assert( pSrc==pSel->pSrc );
          if( pStep->pExprList ) pSel->pEList = 0;
          pSel->pSrc = 0;
          sqlite3SelectDelete(db, pSel);
        }
        if( pStep->pFrom ){
          int i;
          for(i=0; i<pStep->pFrom->nSrc && rc==SQLITE_OK; i++){
            SrcItem *p = &pStep->pFrom->a[i];
            if( p->pSelect ){
              sqlite3SelectPrep(pParse, p->pSelect, 0);
            }
          }
        }

        if(  db->mallocFailed ){
          rc = SQLITE_NOMEM;
        }
        sNC.pSrcList = pSrc;
        if( rc==SQLITE_OK && pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert && rc==SQLITE_OK ){
          Upsert *pUpsert = pStep->pUpsert;
          pUpsert->pUpsertSrc = pSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
        sNC.pSrcList = 0;
        sqlite3SrcListDelete(db, pSrc);
      }else{
        rc = SQLITE_NOMEM;
      }
    }
  }
  return rc;
}